

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_query_node.cpp
# Opt level: O1

void __thiscall duckdb::SetOperationNode::Serialize(SetOperationNode *this,Serializer *serializer)

{
  vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
  local_30;
  
  QueryNode::Serialize(&this->super_QueryNode,serializer);
  (*serializer->_vptr_Serializer[2])(serializer,200,"setop_type");
  Serializer::WriteValue<duckdb::SetOperationType>(serializer,this->setop_type);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>
            (serializer,0xc9,"left",&this->left);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>
            (serializer,0xca,"right",&this->right);
  local_30.
  super__Vector_base<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0xcb,"setop_all",&this->setop_all,(bool *)&local_30);
  SerializeChildNodes(this);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,true>>
            (serializer,0xcc,"children",
             (vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_true>
              *)&local_30);
  ::std::
  vector<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>_>_>
  ::~vector(&local_30);
  return;
}

Assistant:

void SetOperationNode::Serialize(Serializer &serializer) const {
	QueryNode::Serialize(serializer);
	serializer.WriteProperty<SetOperationType>(200, "setop_type", setop_type);
	serializer.WritePropertyWithDefault<unique_ptr<QueryNode>>(201, "left", left);
	serializer.WritePropertyWithDefault<unique_ptr<QueryNode>>(202, "right", right);
	serializer.WritePropertyWithDefault<bool>(203, "setop_all", setop_all, true);
	serializer.WritePropertyWithDefault<vector<unique_ptr<QueryNode>>>(204, "children", SerializeChildNodes());
}